

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationFractionalSpacingTests.cpp
# Opt level: O1

TestStatus *
vkt::tessellation::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,SpacingMode spacingMode)

{
  size_type *psVar1;
  VkDeviceSize bufferSize;
  void **ppvVar2;
  float fVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,_vkt::tessellation::(anonymous_namespace)::LineData,_float>_>
  __comp;
  _Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,_vkt::tessellation::(anonymous_namespace)::LineData,_float>_>
  __comp_00;
  _Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,_vkt::tessellation::(anonymous_namespace)::LineData,_float>_>
  __comp_01;
  pointer pfVar6;
  pointer pfVar7;
  pointer pSVar8;
  undefined8 commandBuffer;
  void *pvVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 obj [8];
  Allocation *pAVar12;
  float fVar13;
  uint uVar14;
  int iVar15;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *pDVar16;
  DescriptorPoolBuilder *pDVar17;
  DescriptorSetUpdateBuilder *pDVar18;
  const_iterator cVar19;
  GraphicsPipelineBuilder *pGVar20;
  ulong uVar21;
  long *plVar22;
  undefined8 *puVar23;
  pointer __x;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
  *p_Var24;
  ulong uVar25;
  pointer pLVar26;
  pointer pLVar27;
  __normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData_*,_std::vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>_>
  __first;
  float *pfVar28;
  pointer pfVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  long *plVar31;
  float *pfVar32;
  LineData *pLVar33;
  int i;
  int iVar34;
  long lVar35;
  pointer pLVar36;
  int *piVar37;
  float *pfVar38;
  undefined8 uVar39;
  qpTestLog *pqVar40;
  undefined1 *__n;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
  *this;
  vector<float,_std::allocator<float>_> *this_00;
  __normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData_*,_std::vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>_>
  __i;
  pointer pLVar41;
  __normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData_*,_std::vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>_>
  __last;
  uint uVar42;
  int iVar43;
  size_type sVar44;
  pointer pSVar45;
  pointer pLVar46;
  int rangeNdx;
  long lVar47;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
  *this_01;
  __normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData_*,_std::vector<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>_>
  __last_00;
  bool bVar48;
  float fVar49;
  float fVar50;
  undefined1 in_stack_fffffffffffff808 [12];
  pointer local_7d0;
  vector<float,_std::allocator<float>_> result_1;
  vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
  segmentsB;
  vector<float,_std::allocator<float>_> tessLevelCases;
  int additionalSegmentLocation;
  float additionalSegmentLength;
  LineData *local_740;
  vector<float,_std::allocator<float>_> sortedCoords;
  vector<float,_std::allocator<float>_> resultTessCoords;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_6d0;
  vector<int,_std::allocator<int>_> additionalSegmentLocations;
  vector<float,_std::allocator<float>_> additionalSegmentLengths;
  VkBufferMemoryBarrier shaderWriteBarrier;
  pointer local_648;
  ios_base local_618 [8];
  ios_base local_610 [132];
  deUint32 local_58c;
  bool local_588;
  VkPrimitiveTopology local_584;
  size_type local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4f8;
  long *plStack_4f0;
  VkAccessFlags local_4e8;
  VkAccessFlags VStack_4e4;
  deUint32 dStack_4e0;
  deUint32 dStack_4dc;
  undefined1 local_4d8 [8];
  pointer pVStack_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8 [6];
  ios_base local_460 [264];
  VkRenderPass local_358;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_350;
  ulong local_330;
  char *local_328;
  long local_320;
  VkQueue local_318;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_310;
  VkPipelineLayout local_308;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_300;
  VkDescriptorSetLayout local_2e8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_2e0;
  Buffer resultBuffer;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_290;
  VkCommandPool local_278;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_270;
  VkFramebuffer local_258;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_250;
  VkDescriptorPool local_238;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_230;
  Buffer tessLevelsBuffer;
  VkDescriptorBufferInfo resultBufferInfo;
  VkDescriptorBufferInfo tessLevelsBufferInfo;
  string failNote;
  ios_base local_138 [264];
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,9);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_318 = Context::getUniversalQueue(context);
  fVar13 = (float)Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar47 = 0;
  do {
    fVar50 = (float)(&tessellation::(anonymous_namespace)::genTessLevelCases()::rangeStarts)[lVar47]
    ;
    iVar34 = 0;
    do {
      fVar49 = (float)iVar34 / 10.0 + fVar50;
      shaderWriteBarrier.sType = (VkStructureType)fVar49;
      if (tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&tessLevelCases,
                   (iterator)
                   tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)&shaderWriteBarrier);
      }
      else {
        *tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish = fVar49;
        tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish =
             tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar34 = iVar34 + 1;
    } while (iVar34 != 10);
    lVar47 = lVar47 + 1;
  } while (lVar47 != 3);
  iVar34 = 0;
  do {
    shaderWriteBarrier.sType = (VkStructureType)((float)iVar34 + 0.3);
    if (tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&tessLevelCases,
                 (iterator)
                 tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,(float *)&shaderWriteBarrier);
    }
    else {
      *tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish = (float)iVar34 + 0.3;
      tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish =
           tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar34 = iVar34 + 1;
  } while (iVar34 != 0x3f);
  pfVar28 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + 1;
  pfVar32 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar38 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pfVar28 !=
      tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish &&
      tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start !=
      tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pfVar38 = pfVar28;
      if (*pfVar28 < *pfVar32 || *pfVar28 == *pfVar32) {
        pfVar38 = pfVar32;
      }
      pfVar28 = pfVar28 + 1;
      pfVar32 = pfVar38;
    } while (pfVar28 !=
             tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  iVar34 = getClampedRoundedTessLevel(spacingMode,*pfVar38);
  bufferSize = (long)(iVar34 + 1) * 4 + 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&shaderWriteBarrier,bufferSize,0x20);
  tessellation::Buffer::Buffer
            (&resultBuffer,vk,device,allocator,(VkBufferCreateInfo *)&shaderWriteBarrier,
             (MemoryRequirement)0x1);
  makeBufferCreateInfo((VkBufferCreateInfo *)&shaderWriteBarrier,4,0x20);
  tessellation::Buffer::Buffer
            (&tessLevelsBuffer,vk,device,allocator,(VkBufferCreateInfo *)&shaderWriteBarrier,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier);
  pDVar16 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,2,(VkSampler *)0x0);
  pDVar16 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (pDVar16,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,4,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_4d8,pDVar16,vk,device,0);
  DStack_2e0.m_device = (VkDevice)local_4c8[0]._0_8_;
  DStack_2e0.m_allocator = (VkAllocationCallbacks *)local_4c8[0]._8_8_;
  local_2e8.m_internal = (deUint64)local_4d8;
  DStack_2e0.m_deviceIface = (DeviceInterface *)pVStack_4d0;
  local_4d8 = (undefined1  [8])0x0;
  pVStack_4d0 = (pointer)0x0;
  local_4c8[0]._M_allocated_capacity = (pointer)0x0;
  local_4c8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if (shaderWriteBarrier.size != 0) {
    operator_delete((void *)shaderWriteBarrier.size,(long)local_648 - shaderWriteBarrier.size);
  }
  if (shaderWriteBarrier._24_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._24_8_,
                    shaderWriteBarrier.offset - shaderWriteBarrier._24_8_);
  }
  if (shaderWriteBarrier._0_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._0_8_,
                    shaderWriteBarrier._16_8_ - shaderWriteBarrier._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_4d8);
  pDVar17 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)local_4d8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar17 = ::vk::DescriptorPoolBuilder::addType(pDVar17,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&shaderWriteBarrier,pDVar17,vk,device,1,1);
  DStack_230.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_230.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_238.m_internal = shaderWriteBarrier._0_8_;
  DStack_230.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  if (local_4d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4d8,local_4c8[0]._M_allocated_capacity - (long)local_4d8);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&shaderWriteBarrier,vk,device,local_238
                    ,local_2e8);
  local_4e8 = shaderWriteBarrier.srcAccessMask;
  VStack_4e4 = shaderWriteBarrier.dstAccessMask;
  dStack_4e0 = shaderWriteBarrier.srcQueueFamilyIndex;
  dStack_4dc = shaderWriteBarrier.dstQueueFamilyIndex;
  local_4f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)shaderWriteBarrier._0_8_;
  plStack_4f0 = (long *)shaderWriteBarrier.pNext;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier);
  pDVar18 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier,(int)local_4f8,(void *)0x0,
                       0);
  pDVar18 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write(pDVar18,(int)local_4f8,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar18,vk,device);
  if (shaderWriteBarrier.size != 0) {
    operator_delete((void *)shaderWriteBarrier.size,(long)local_648 - shaderWriteBarrier.size);
  }
  if (shaderWriteBarrier._24_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._24_8_,
                    shaderWriteBarrier.offset - shaderWriteBarrier._24_8_);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&shaderWriteBarrier);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&shaderWriteBarrier,vk,device);
  DStack_350.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_350.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_358.m_internal = shaderWriteBarrier._0_8_;
  DStack_350.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&shaderWriteBarrier,vk,device,
             (VkRenderPass)shaderWriteBarrier._0_8_);
  DStack_250.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_250.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_258.m_internal = shaderWriteBarrier._0_8_;
  DStack_250.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&shaderWriteBarrier,vk,device,
                     local_2e8);
  DStack_300.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_300.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_308.m_internal = shaderWriteBarrier._0_8_;
  DStack_300.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&shaderWriteBarrier,vk,device,
                  (deUint32)fVar13);
  DStack_270.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_270.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_278.m_internal = shaderWriteBarrier._0_8_;
  DStack_270.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&shaderWriteBarrier,vk,device,
             (VkCommandPool)shaderWriteBarrier._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uVar11 = shaderWriteBarrier._24_8_;
  uVar10 = shaderWriteBarrier._16_8_;
  pvVar9 = shaderWriteBarrier.pNext;
  commandBuffer = shaderWriteBarrier._0_8_;
  memset(&shaderWriteBarrier,0,0xfc);
  local_58c = 1;
  local_588 = false;
  local_584 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  failNote._M_dataplus._M_p = (pointer)&failNote.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&failNote,"vert","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,&failNote);
  pGVar20 = GraphicsPipelineBuilder::setShader
                      ((GraphicsPipelineBuilder *)&shaderWriteBarrier,vk,device,
                       VK_SHADER_STAGE_VERTEX_BIT,*(ProgramBinary **)(cVar19._M_node + 2),
                       (VkSpecializationInfo *)0x0);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&result_1,"tesc","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)&result_1);
  pGVar20 = GraphicsPipelineBuilder::setShader
                      (pGVar20,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                       *(ProgramBinary **)(cVar19._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  segmentsB.
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&segmentsB.
                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&segmentsB,"tese","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)&segmentsB);
  pGVar20 = GraphicsPipelineBuilder::setShader
                      (pGVar20,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                       *(ProgramBinary **)(cVar19._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_4d8,pGVar20,vk,device,local_308,
             local_358);
  obj = local_4d8;
  DStack_290.m_device = (VkDevice)local_4c8[0]._0_8_;
  DStack_290.m_allocator = (VkAllocationCallbacks *)local_4c8[0]._8_8_;
  DStack_290.m_deviceIface = (DeviceInterface *)pVStack_4d0;
  local_4d8 = (undefined1  [8])0x0;
  pVStack_4d0 = (pointer)0x0;
  local_4c8[0]._M_allocated_capacity = (qpTestLog *)0x0;
  local_4c8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if (segmentsB.
      super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&segmentsB.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pGVar20 = (GraphicsPipelineBuilder *)
              ((long)&(segmentsB.
                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->index + 1);
    operator_delete(segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start,(ulong)pGVar20);
  }
  if ((pointer *)
      result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    pGVar20 = (GraphicsPipelineBuilder *)
              ((long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 1);
    operator_delete(result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,(ulong)pGVar20);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)failNote._M_dataplus._M_p != &failNote.field_2) {
    pGVar20 = (GraphicsPipelineBuilder *)(failNote.field_2._M_allocated_capacity + 1);
    operator_delete(failNote._M_dataplus._M_p,(ulong)pGVar20);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)&shaderWriteBarrier);
  additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_328 = "odd";
    if (spacingMode == SPACINGMODE_FRACTIONAL_EVEN) {
      local_328 = "even";
    }
    local_320 = (ulong)(spacingMode == SPACINGMODE_FRACTIONAL_EVEN) + 3;
    pLVar33 = (LineData *)0x0;
    do {
      *(float *)(tessLevelsBuffer.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
                m_hostPtr =
           tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[(long)pLVar33];
      local_740 = pLVar33;
      ::vk::flushMappedMemoryRange
                (vk,device,
                 (VkDeviceMemory)
                 ((tessLevelsBuffer.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_memory).m_internal,
                 (tessLevelsBuffer.m_allocation.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_offset,4);
      pAVar12 = resultBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      memset((resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr,0,bufferSize);
      ::vk::flushMappedMemoryRange
                (vk,device,(VkDeviceMemory)(pAVar12->m_memory).m_internal,pAVar12->m_offset,
                 bufferSize);
      beginCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
      beginRenderPassWithRasterizationDisabled
                (vk,(VkCommandBuffer)commandBuffer,local_358,local_258);
      (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,0,obj);
      (*vk->_vptr_DeviceInterface[0x56])(vk,commandBuffer,0,local_308.m_internal,0,1,&local_4f8,0,0)
      ;
      (*vk->_vptr_DeviceInterface[0x59])(vk,commandBuffer,1,1,0,0);
      endRenderPass(vk,(VkCommandBuffer)commandBuffer);
      makeBufferMemoryBarrier
                (&shaderWriteBarrier,0x40,0x2000,
                 (VkBuffer)
                 resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,0,bufferSize);
      iVar34 = 0;
      (*vk->_vptr_DeviceInterface[0x6d])
                (vk,commandBuffer,0x8000,0x4000,0,0,0,1,&shaderWriteBarrier,0,0);
      endCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
      submitCommandsAndWait(vk,device,local_318,(VkCommandBuffer)commandBuffer);
      pAVar12 = resultBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)context->m_testCtx->m_log;
      ::vk::invalidateMappedMemoryRange
                (vk,device,
                 (VkDeviceMemory)
                 ((resultBuffer.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_memory).m_internal,
                 (resultBuffer.m_allocation.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_offset,bufferSize);
      piVar37 = (int *)pAVar12->m_hostPtr;
      sVar44 = (size_type)*piVar37;
      std::vector<float,_std::allocator<float>_>::vector
                (&resultTessCoords,sVar44,(allocator_type *)&shaderWriteBarrier);
      memcpy(resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,piVar37 + 1,sVar44 << 2);
      fVar50 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[(long)pLVar33];
      fVar13 = getClampedTessLevel(spacingMode,fVar50);
      uVar14 = getRoundedTessLevel(spacingMode,fVar13);
      std::vector<float,_std::allocator<float>_>::vector(&sortedCoords,&resultTessCoords);
      pfVar6 = sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar29 = sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start !=
          sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar21 = (long)sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        lVar47 = 0x3f;
        if (uVar21 != 0) {
          for (; uVar21 >> lVar47 == 0; lVar47 = lVar47 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,((uint)lVar47 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pfVar29,pfVar6);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier);
      std::ostream::_M_insert<double>((double)fVar50);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier);
      std::ios_base::~ios_base(local_618);
      plVar22 = (long *)std::__cxx11::string::replace((ulong)&segmentsB,0,(char *)0x0,0xb755c3);
      result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      pfVar29 = (pointer)(plVar22 + 2);
      if ((pointer)*plVar22 == pfVar29) {
        result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = *(pointer *)pfVar29;
      }
      else {
        result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = *(pointer *)pfVar29;
        result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)*plVar22;
      }
      result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar22[1];
      *plVar22 = (long)pfVar29;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      plVar22 = (long *)std::__cxx11::string::append((char *)&result_1);
      local_4d8 = (undefined1  [8])local_4c8;
      paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar22 == paVar30) {
        local_4c8[0]._0_8_ = paVar30->_M_allocated_capacity;
        local_4c8[0]._8_8_ = plVar22[3];
      }
      else {
        local_4c8[0]._0_8_ = paVar30->_M_allocated_capacity;
        local_4d8 = (undefined1  [8])*plVar22;
      }
      pVStack_4d0 = (pointer)plVar22[1];
      *plVar22 = (long)paVar30;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      local_6d0._M_current =
           sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_310._M_current =
           sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      elemsStr<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                ((string *)&shaderWriteBarrier,(tessellation *)&local_6d0,&local_310,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 0x0,0,iVar34);
      uVar39 = (qpTestLog *)0xf;
      if (local_4d8 != (undefined1  [8])local_4c8) {
        uVar39 = local_4c8[0]._M_allocated_capacity;
      }
      if ((ulong)uVar39 < (qpTestLog *)((long)shaderWriteBarrier.pNext + (long)pVStack_4d0)) {
        pqVar40 = (qpTestLog *)0xf;
        if ((VkAccessFlags *)shaderWriteBarrier._0_8_ != &shaderWriteBarrier.srcAccessMask) {
          pqVar40 = (qpTestLog *)shaderWriteBarrier._16_8_;
        }
        if (pqVar40 < (qpTestLog *)((long)shaderWriteBarrier.pNext + (long)pVStack_4d0))
        goto LAB_007ab106;
        puVar23 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&shaderWriteBarrier,0,(char *)0x0,(ulong)local_4d8);
      }
      else {
LAB_007ab106:
        puVar23 = (undefined8 *)std::__cxx11::string::_M_append(local_4d8,shaderWriteBarrier._0_8_);
      }
      failNote._M_dataplus._M_p = (pointer)&failNote.field_2;
      psVar1 = puVar23 + 2;
      if ((size_type *)*puVar23 == psVar1) {
        failNote.field_2._M_allocated_capacity = *psVar1;
        failNote.field_2._8_8_ = puVar23[3];
      }
      else {
        failNote.field_2._M_allocated_capacity = *psVar1;
        failNote._M_dataplus._M_p = (pointer)*puVar23;
      }
      failNote._M_string_length = puVar23[1];
      *puVar23 = psVar1;
      puVar23[1] = 0;
      *(char *)psVar1 = '\0';
      __n = (undefined1 *)failNote._M_string_length;
      if ((VkAccessFlags *)shaderWriteBarrier._0_8_ != &shaderWriteBarrier.srcAccessMask) {
        __n = (undefined1 *)(shaderWriteBarrier._16_8_ + 1);
        operator_delete((void *)shaderWriteBarrier._0_8_,(ulong)__n);
      }
      if (local_4d8 != (undefined1  [8])local_4c8) {
        __n = (undefined1 *)(local_4c8[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_4d8,(ulong)__n);
      }
      if ((pointer *)
          result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start !=
          &result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        __n = (undefined1 *)
              ((long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 1);
        operator_delete(result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)__n);
      }
      if (segmentsB.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = (undefined1 *)
              ((long)&(segmentsB.
                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->index + 1);
        operator_delete(segmentsB.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)__n);
      }
      if (uVar14 + 1 ==
          (int)((ulong)((long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2)) {
        if ((((*sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != 0.0) ||
             (NAN(*sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start))) ||
            (sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish[-1] != 1.0)) ||
           (NAN(sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish[-1]))) {
          local_4d8 = (undefined1  [8])paVar5;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4d0,
                     "Failure: smallest coordinate should be 0.0 and biggest should be 1.0",0x44);
          shaderWriteBarrier._0_8_ =
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                     failNote._M_string_length);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&shaderWriteBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
          std::ios_base::~ios_base(local_610);
          goto LAB_007ab4a0;
        }
        if ((int)uVar14 < 0) {
          std::__throw_length_error("cannot create std::vector larger than max_size()");
        }
        this = (_Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                *)(long)(int)uVar14;
        __x = std::
              _Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ::_M_allocate(this,(size_t)__n);
        p_Var24 = this;
        pSVar45 = __x;
        if (uVar14 != 0) {
          do {
            pSVar45->index = -1;
            pSVar45->length = -1.0;
            pSVar45 = pSVar45 + 1;
            p_Var24 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                       *)((long)&p_Var24[-1]._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
          } while (p_Var24 !=
                   (_Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    *)0x0);
        }
        if (uVar14 != 0) {
          uVar21 = 1;
          if (1 < (int)uVar14) {
            uVar21 = (ulong)uVar14;
          }
          uVar25 = 0;
          do {
            fVar50 = sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar25 + 1];
            fVar49 = sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar25];
            __x[uVar25].index = (int)uVar25;
            __x[uVar25].length = fVar50 - fVar49;
            uVar25 = uVar25 + 1;
          } while (uVar21 != uVar25);
        }
        uVar21 = (long)pSVar45 - (long)__x;
        sVar44 = (long)uVar21 >> 3;
        std::vector<float,_std::allocator<float>_>::vector
                  (&result_1,sVar44,(allocator_type *)&segmentsB);
        uVar42 = (uint)(uVar21 >> 3);
        if (0 < (int)uVar42) {
          uVar25 = 0;
          do {
            result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar25] = __x[uVar25].length;
            uVar25 = uVar25 + 1;
          } while ((uVar42 & 0x7fffffff) != uVar25);
        }
        segmentsB.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_6d0._M_current =
             result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        elemsStr<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                  ((string *)local_4d8,(tessellation *)&segmentsB,&local_6d0,
                   (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   0x0,0,iVar34);
        plVar22 = (long *)std::__cxx11::string::replace((ulong)local_4d8,0,(char *)0x0,0xb75712);
        shaderWriteBarrier._0_8_ = &shaderWriteBarrier.srcAccessMask;
        plVar31 = plVar22 + 2;
        if ((long *)*plVar22 == plVar31) {
          shaderWriteBarrier._16_8_ = *plVar31;
          shaderWriteBarrier._24_8_ = plVar22[3];
        }
        else {
          shaderWriteBarrier._16_8_ = *plVar31;
          shaderWriteBarrier._0_8_ = (long *)*plVar22;
        }
        shaderWriteBarrier.pNext = (void *)plVar22[1];
        *plVar22 = (long)plVar31;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&failNote,shaderWriteBarrier._0_8_);
        if ((VkAccessFlags *)shaderWriteBarrier._0_8_ != &shaderWriteBarrier.srcAccessMask) {
          operator_delete((void *)shaderWriteBarrier._0_8_,shaderWriteBarrier._16_8_ + 1);
        }
        if (local_4d8 != (undefined1  [8])local_4c8) {
          operator_delete((void *)local_4d8,(ulong)(local_4c8[0]._M_allocated_capacity + 1));
        }
        if (result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        segmentsB.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        segmentsB.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        segmentsB.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_330 = uVar21 >> 3;
        std::
        vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
        ::push_back((vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                     *)&result_1,__x);
        local_500 = sVar44;
        if (1 < (int)(uint)sVar44) {
          lVar47 = (ulong)((uint)sVar44 & 0x7fffffff) - 1;
          pSVar45 = __x;
          do {
            pSVar8 = segmentsB.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pfVar29 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            fVar49 = pSVar45[1].length -
                     result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[1];
            fVar50 = -fVar49;
            if (-fVar49 <= fVar49) {
              fVar50 = fVar49;
            }
            this_00 = &result_1;
            if ((0.001 <= fVar50) &&
               (this_00 = (vector<float,_std::allocator<float>_> *)&segmentsB,
               segmentsB.
               super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               segmentsB.
               super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
              fVar49 = pSVar45[1].length -
                       (segmentsB.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start)->length;
              fVar50 = -fVar49;
              if (-fVar49 <= fVar49) {
                fVar50 = fVar49;
              }
              if (0.001 <= fVar50) {
                local_4d8 = (undefined1  [8])paVar5;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pVStack_4d0,
                           "Failure: couldn\'t divide segments to 2 groups by length; ",0x39);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pVStack_4d0,"e.g. segment of length ",0x17);
                std::ostream::_M_insert<double>((double)pSVar45[1].length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pVStack_4d0," isn\'t approximately equal to either ",0x25);
                std::ostream::_M_insert<double>((double)pfVar29[1]);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0," or ",4)
                ;
                std::ostream::_M_insert<double>((double)pSVar8->length);
                shaderWriteBarrier._0_8_ =
                     tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_4d8,
                                (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::ostringstream
                          ((ostringstream *)&shaderWriteBarrier.pNext);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                           failNote._M_string_length);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&shaderWriteBarrier,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream
                          ((ostringstream *)&shaderWriteBarrier.pNext);
                std::ios_base::~ios_base(local_610);
                goto LAB_007abe88;
              }
            }
            std::
            vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
            ::push_back((vector<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                         *)this_00,pSVar45 + 1);
            lVar47 = lVar47 + -1;
            pSVar45 = pSVar45 + 1;
          } while (lVar47 != 0);
        }
        uVar25 = local_330;
        pfVar7 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        pfVar6 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pfVar29 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (((fVar13 != (float)(int)uVar14) || (NAN(fVar13) || NAN((float)(int)uVar14))) ||
           ((result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start ==
             result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish ||
            (segmentsB.
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             segmentsB.
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
             ._M_impl.super__Vector_impl_data._M_finish)))) {
          if ((result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start !=
               result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish) &&
             (segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            if (((long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start != 0x10) &&
               ((long)segmentsB.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)segmentsB.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0x10)) {
              local_4d8 = (undefined1  [8])paVar5;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pVStack_4d0,
                         "Failure: when dividing the segments to 2 groups by length, neither of the two groups has exactly 2 or 0 segments in it"
                         ,0x76);
              shaderWriteBarrier._0_8_ =
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_4d8,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                         failNote._M_string_length);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&shaderWriteBarrier,
                         (EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_007aba4d;
            }
            if ((long)segmentsB.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)segmentsB.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0x10) {
              result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)segmentsB.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)segmentsB.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)segmentsB.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)pfVar29;
              segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)pfVar6;
              segmentsB.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pfVar7;
            }
            pfVar7 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            pfVar6 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pfVar29 = result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x10) {
              if (result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[1] <
                  (segmentsB.
                   super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                   ._M_impl.super__Vector_impl_data._M_start)->length) {
                result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)segmentsB.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)segmentsB.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)segmentsB.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                segmentsB.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pfVar29;
                segmentsB.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)pfVar6;
                segmentsB.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pfVar7;
              }
            }
            else if (result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[1] + 0.001 <
                     (segmentsB.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start)->length) {
              local_4d8 = (undefined1  [8])paVar5;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pVStack_4d0,
                         "Failure: the two additional segments are longer than the other segments",
                         0x47);
              shaderWriteBarrier._0_8_ =
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_4d8,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                         failNote._M_string_length);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&shaderWriteBarrier,
                         (EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_007aba4d;
            }
            pSVar45 = segmentsB.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar34 = (segmentsB.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start)->index;
            iVar43 = segmentsB.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].index;
            if (iVar34 + iVar43 + 1 == (int)local_500) {
              additionalSegmentLength =
                   (segmentsB.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start)->length;
              if ((((long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start != 0x10) ||
                  (additionalSegmentLocation = -1,
                  additionalSegmentLength <
                  result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[1] + -0.001)) &&
                 (additionalSegmentLocation = iVar43, iVar34 < iVar43)) {
                additionalSegmentLocation = iVar34;
              }
              goto LAB_007abaa8;
            }
            local_4d8 = (undefined1  [8])paVar5;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pVStack_4d0,
                       "Failure: the two additional segments aren\'t placed symmetrically; ",0x42);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pVStack_4d0,"one is at index ",0x10);
            std::ostream::operator<<((ostringstream *)&pVStack_4d0,pSVar45->index);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pVStack_4d0," and other is at index ",0x17);
            std::ostream::operator<<((ostringstream *)&pVStack_4d0,pSVar45[1].index);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pVStack_4d0," (note: the two indexes should sum to ",0x26);
            std::ostream::operator<<((ostringstream *)&pVStack_4d0,(int)uVar25 + -1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pVStack_4d0,", i.e. numberOfSegments-1)",0x1a);
            shaderWriteBarrier._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                       failNote._M_string_length);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&shaderWriteBarrier,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
            std::ios_base::~ios_base(local_610);
            goto LAB_007abe88;
          }
          additionalSegmentLength = -1.0;
          if (uVar21 != 8) {
            additionalSegmentLength = __x->length;
          }
          additionalSegmentLocation = -1;
LAB_007abaa8:
          bVar48 = true;
        }
        else {
          local_4d8 = (undefined1  [8])paVar5;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4d0,
                     "Failure: clamped and final tessellation level are equal, but not all segments are of equal length."
                     ,0x62);
          shaderWriteBarrier._0_8_ =
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                     failNote._M_string_length);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&shaderWriteBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_007aba4d:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
          std::ios_base::~ios_base(local_610);
LAB_007abe88:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4d0);
          std::ios_base::~ios_base(local_460);
          bVar48 = false;
        }
        if (segmentsB.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(segmentsB.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)segmentsB.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)segmentsB.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::Segment,_std::allocator<vkt::tessellation::(anonymous_namespace)::Segment>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)result_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        pGVar20 = (GraphicsPipelineBuilder *)((long)this << 3);
        operator_delete(__x,(ulong)pGVar20);
      }
      else {
        local_4d8 = (undefined1  [8])paVar5;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,"Failure: number of vertices is ",0x1f);
        std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_4d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,"; expected ",0xb);
        std::ostream::operator<<((ostringstream *)&pVStack_4d0,uVar14 + 1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0," (clamped tessellation level is ",0x20);
        std::ostream::_M_insert<double>((double)fVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,")",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,"; final level (clamped level rounded up to ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,local_328,local_320);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4d0,") is ",5);
        std::ostream::operator<<(&pVStack_4d0,uVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4d0,
                   " and should equal the number of segments, i.e. number of vertices minus 1",0x49)
        ;
        shaderWriteBarrier._0_8_ =
             tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&shaderWriteBarrier.pNext,failNote._M_dataplus._M_p,
                   failNote._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&shaderWriteBarrier,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
        std::ios_base::~ios_base(local_610);
LAB_007ab4a0:
        pGVar20 = (GraphicsPipelineBuilder *)&std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4d0);
        std::ios_base::~ios_base(local_460);
        bVar48 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)failNote._M_dataplus._M_p != &failNote.field_2) {
        pGVar20 = (GraphicsPipelineBuilder *)(failNote.field_2._M_allocated_capacity + 1);
        operator_delete(failNote._M_dataplus._M_p,(ulong)pGVar20);
      }
      if (sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        pGVar20 = (GraphicsPipelineBuilder *)
                  ((long)sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage -
                  (long)sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
        operator_delete(sortedCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)pGVar20);
      }
      if (!bVar48) {
        if (resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          pGVar20 = (GraphicsPipelineBuilder *)
                    ((long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start);
          operator_delete(resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start,(ulong)pGVar20);
        }
        goto LAB_007abf06;
      }
      if (additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&additionalSegmentLengths,
                   (iterator)
                   additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&additionalSegmentLength);
      }
      else {
        *additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish = additionalSegmentLength;
        additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish =
             additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        pGVar20 = (GraphicsPipelineBuilder *)
                  additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&additionalSegmentLocations,
                   (iterator)
                   additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&additionalSegmentLocation);
      }
      else {
        *additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish = additionalSegmentLocation;
        pGVar20 = (GraphicsPipelineBuilder *)
                  (additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1);
        additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)pGVar20;
      }
      if (resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        pGVar20 = (GraphicsPipelineBuilder *)
                  ((long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage -
                  (long)resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
        operator_delete(resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)pGVar20);
      }
      if ((!bVar48) ||
         (pLVar33 = (LineData *)(ulong)((int)local_740 + 1),
         (LineData *)
         ((long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2) <= pLVar33)) goto LAB_007abf06;
    } while( true );
  }
  bVar48 = false;
LAB_007abf06:
  if (bVar48) {
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)context->m_testCtx->m_log;
    if ((int)((ulong)((long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) < 1) {
      pLVar36 = (pointer)0x0;
      local_7d0 = (pointer)0x0;
      pLVar26 = (pointer)0x0;
    }
    else {
      pLVar36 = (pointer)0x0;
      local_7d0 = (pointer)0x0;
      lVar47 = 0;
      pLVar41 = (pointer)0x0;
      fVar50 = fVar13;
      do {
        fVar49 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar47];
        fVar13 = additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar47];
        iVar34 = additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar47];
        if (pLVar36 == local_7d0) {
          lVar35 = (long)pLVar36 - (long)pLVar41;
          if (lVar35 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar25 = (lVar35 >> 2) * -0x5555555555555555;
          uVar21 = uVar25;
          if (pLVar36 == pLVar41) {
            uVar21 = 1;
          }
          this_01 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                     *)(uVar21 + uVar25);
          if ((_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
               *)0xaaaaaaaaaaaaaa9 < this_01) {
            this_01 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                       *)0xaaaaaaaaaaaaaaa;
          }
          if (CARRY8(uVar21,uVar25)) {
            this_01 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                       *)0xaaaaaaaaaaaaaaa;
          }
          pLVar26 = std::
                    _Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                    ::_M_allocate(this_01,(size_t)pGVar20);
          *(float *)((long)pLVar26 + lVar35) = fVar49;
          *(float *)((long)pLVar26 + lVar35 + 4) = fVar13;
          *(int *)((long)pLVar26 + lVar35 + 8) = iVar34;
          pLVar46 = pLVar26;
          for (pLVar27 = pLVar41; pLVar36 != pLVar27; pLVar27 = pLVar27 + 1) {
            pLVar46->additionalSegmentLocation = pLVar27->additionalSegmentLocation;
            fVar50 = pLVar27->additionalSegmentLength;
            pLVar46->tessLevel = pLVar27->tessLevel;
            pLVar46->additionalSegmentLength = fVar50;
            pLVar46 = pLVar46 + 1;
          }
          if (pLVar41 != (pointer)0x0) {
            pGVar20 = (GraphicsPipelineBuilder *)((long)local_7d0 - (long)pLVar41);
            operator_delete(pLVar41,(ulong)pGVar20);
          }
          local_7d0 = pLVar26 + (long)this_01;
        }
        else {
          pLVar36->tessLevel = fVar49;
          pLVar36->additionalSegmentLength = fVar13;
          pLVar36->additionalSegmentLocation = iVar34;
          pLVar26 = pLVar41;
          pLVar46 = pLVar36;
          fVar13 = fVar50;
        }
        pLVar36 = pLVar46 + 1;
        lVar47 = lVar47 + 1;
        pLVar41 = pLVar26;
        fVar50 = fVar13;
      } while (lVar47 < (int)((ulong)((long)tessLevelCases.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)tessLevelCases.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start) >> 2));
    }
    __first._M_current =
         std::
         _Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
         ::_M_allocate((_Vector_base<vkt::tessellation::(anonymous_namespace)::LineData,_std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>_>
                        *)(((long)pLVar36 - (long)pLVar26 >> 2) * -0x5555555555555555),
                       (size_t)pGVar20);
    __last_00._M_current = __first._M_current;
    for (pLVar41 = pLVar26; pLVar41 != pLVar36; pLVar41 = pLVar41 + 1) {
      (__last_00._M_current)->additionalSegmentLocation = pLVar41->additionalSegmentLocation;
      fVar50 = pLVar41->additionalSegmentLength;
      (__last_00._M_current)->tessLevel = pLVar41->tessLevel;
      (__last_00._M_current)->additionalSegmentLength = fVar50;
      __last_00._M_current = __last_00._M_current + 1;
    }
    if (__first._M_current != __last_00._M_current) {
      uVar21 = ((long)__last_00._M_current - (long)__first._M_current >> 2) * -0x5555555555555555;
      lVar47 = 0x3f;
      if (uVar21 != 0) {
        for (; uVar21 >> lVar47 == 0; lVar47 = lVar47 + -1) {
        }
      }
      __comp._M_comp._12_4_ = fVar13;
      __comp._M_comp._0_12_ = in_stack_fffffffffffff808;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData*,std::vector<vkt::tessellation::(anonymous_namespace)::LineData,std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,vkt::tessellation::(anonymous_namespace)::LineData,float>>>
                (__first,__last_00,(ulong)(((uint)lVar47 ^ 0x3f) * 2) ^ 0x7e,__comp);
      if ((long)__last_00._M_current - (long)__first._M_current < 0xc1) {
        __comp_01._M_comp._12_4_ = fVar13;
        __comp_01._M_comp._0_12_ = in_stack_fffffffffffff808;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData*,std::vector<vkt::tessellation::(anonymous_namespace)::LineData,std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>>>,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,vkt::tessellation::(anonymous_namespace)::LineData,float>>>
                  (__first,__last_00,__comp_01);
      }
      else {
        __last._M_current = __first._M_current + 0x10;
        __comp_00._M_comp._12_4_ = fVar13;
        __comp_00._M_comp._0_12_ = in_stack_fffffffffffff808;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::LineData*,std::vector<vkt::tessellation::(anonymous_namespace)::LineData,std::allocator<vkt::tessellation::(anonymous_namespace)::LineData>>>,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::MemberPred<std::less<float>,vkt::tessellation::(anonymous_namespace)::LineData,float>>>
                  (__first,__last,__comp_00);
        for (; __last._M_current != __last_00._M_current; __last._M_current = __last._M_current + 1)
        {
          fVar13 = (__last._M_current)->tessLevel;
          fVar49 = (__last._M_current)->additionalSegmentLength;
          iVar34 = (__last._M_current)->additionalSegmentLocation;
          fVar50 = __last._M_current[-1].tessLevel;
          pLVar33 = __last._M_current;
          while (fVar13 < fVar50) {
            pLVar33->additionalSegmentLocation = pLVar33[-1].additionalSegmentLocation;
            fVar50 = pLVar33[-1].additionalSegmentLength;
            pLVar33->tessLevel = pLVar33[-1].tessLevel;
            pLVar33->additionalSegmentLength = fVar50;
            fVar50 = pLVar33[-2].tessLevel;
            pLVar33 = pLVar33 + -1;
          }
          pLVar33->tessLevel = fVar13;
          pLVar33->additionalSegmentLength = fVar49;
          pLVar33->additionalSegmentLocation = iVar34;
        }
      }
    }
    uVar14 = (int)((long)__last_00._M_current - (long)__first._M_current >> 2) * -0x55555555;
    local_740 = __first._M_current;
    if (1 < (int)uVar14) {
      ppvVar2 = &shaderWriteBarrier.pNext;
      lVar47 = (ulong)(uVar14 & 0x7fffffff) - 1;
      piVar37 = &__first._M_current[1].additionalSegmentLocation;
      do {
        iVar34 = 7;
        if ((-1 < *piVar37) && (-1 < piVar37[-3])) {
          fVar13 = getClampedTessLevel(spacingMode,((LineData *)(piVar37 + -2))->tessLevel);
          fVar50 = getClampedTessLevel(spacingMode,(float)piVar37[-5]);
          iVar34 = 0;
          if ((fVar13 == fVar50) &&
             ((iVar34 = 0, !NAN(fVar13) && !NAN(fVar50) && (*piVar37 != piVar37[-3])))) {
            local_4d8 = (undefined1  [8])paVar5;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pVStack_4d0,
                       "Failure: additional segments not located identically for two edges with identical clamped tessellation levels"
                       ,0x6d);
            shaderWriteBarrier._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)ppvVar2,"Note: tessellation levels are ",0x1e);
            std::ostream::_M_insert<double>((double)((LineData *)(piVar37 + -2))->tessLevel);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
            std::ostream::_M_insert<double>((double)(float)piVar37[-5]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)ppvVar2," (clamped level ",0x10);
            fVar13 = getClampedTessLevel(spacingMode,((LineData *)(piVar37 + -2))->tessLevel);
            std::ostream::_M_insert<double>((double)fVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)ppvVar2,"; but first additional segments located at indices ",0x33
                      );
            std::ostream::operator<<(ppvVar2,*piVar37);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
            std::ostream::operator<<(ppvVar2,piVar37[-3]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)ppvVar2,", respectively",0xe);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&shaderWriteBarrier,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
            std::ios_base::~ios_base(local_610);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4d0);
            std::ios_base::~ios_base(local_460);
            iVar34 = 1;
          }
        }
        if ((iVar34 != 7) && (iVar34 != 0)) goto LAB_007ac3fb;
        piVar37 = piVar37 + 3;
        lVar47 = lVar47 + -1;
      } while (lVar47 != 0);
    }
    iVar34 = 5;
LAB_007ac3fb:
    if (iVar34 == 5) {
      if (1 < (int)uVar14) {
        lVar47 = (ulong)(uVar14 & 0x7fffffff) - 1;
        pfVar28 = &local_740[1].additionalSegmentLength;
        do {
          iVar43 = 10;
          if ((0.0 < *pfVar28 || *pfVar28 == 0.0) && (0.0 < pfVar28[-3] || pfVar28[-3] == 0.0)) {
            fVar13 = getClampedTessLevel(spacingMode,((LineData *)(pfVar28 + -1))->tessLevel);
            fVar50 = getClampedTessLevel(spacingMode,pfVar28[-4]);
            iVar34 = getRoundedTessLevel(spacingMode,fVar13);
            iVar15 = getRoundedTessLevel(spacingMode,fVar50);
            if (iVar34 == iVar15) {
              fVar49 = pfVar28[-3];
              fVar3 = *pfVar28;
              if (fVar3 < fVar49) {
LAB_007ac4c7:
                failNote._M_dataplus._M_p = (pointer)paVar5;
                std::__cxx11::ostringstream::ostringstream
                          ((ostringstream *)&failNote._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&failNote._M_string_length,
                           "Failure: additional segment length isn\'t monotonically decreasing with the fraction <n> - <f>, among edges with same final tessellation level"
                           ,0x8d);
                local_4d8 = (undefined1  [8])
                            tcu::MessageBuilder::operator<<
                                      ((MessageBuilder *)&failNote,
                                       (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pVStack_4d0,
                           "Note: <f> stands for the clamped tessellation level and <n> for the final (rounded and clamped) tessellation level"
                           ,0x72);
                shaderWriteBarrier._0_8_ =
                     tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_4d8,
                                (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::ostringstream
                          ((ostringstream *)&shaderWriteBarrier.pNext);
                ppvVar2 = &shaderWriteBarrier.pNext;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)ppvVar2,"Note: two edges have tessellation levels ",0x29);
                std::ostream::_M_insert<double>((double)pfVar28[-4]);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
                std::ostream::_M_insert<double>((double)((LineData *)(pfVar28 + -1))->tessLevel);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)ppvVar2," respectively",0xd);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)ppvVar2,", clamped ",10);
                std::ostream::_M_insert<double>((double)fVar50);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
                std::ostream::_M_insert<double>((double)fVar13);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,", final ",8);
                std::ostream::operator<<(ppvVar2,iVar15);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
                std::ostream::operator<<(ppvVar2,iVar34);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)ppvVar2,"; fractions are ",0x10);
                std::ostream::_M_insert<double>((double)((float)iVar15 - fVar50));
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
                std::ostream::_M_insert<double>((double)((float)iVar34 - fVar13));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)ppvVar2,", but resulted in segment lengths ",0x22);
                std::ostream::_M_insert<double>((double)pfVar28[-3]);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," and ",5);
                std::ostream::_M_insert<double>((double)*pfVar28);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&shaderWriteBarrier,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
                std::ios_base::~ios_base(local_610);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4d0);
                std::ios_base::~ios_base(local_460);
                std::__cxx11::ostringstream::~ostringstream
                          ((ostringstream *)&failNote._M_string_length);
                std::ios_base::~ios_base(local_138);
                iVar43 = 1;
              }
              else {
                iVar43 = 0;
                if ((fVar13 == fVar50) && (iVar43 = 0, !NAN(fVar13) && !NAN(fVar50))) {
                  if ((fVar3 != fVar49) || (NAN(fVar3) || NAN(fVar49))) goto LAB_007ac4c7;
                }
              }
            }
          }
          if ((iVar43 != 10) && (iVar43 != 0)) goto LAB_007ac77d;
          pfVar28 = pfVar28 + 3;
          lVar47 = lVar47 + -1;
        } while (lVar47 != 0);
      }
      iVar43 = 8;
LAB_007ac77d:
      iVar34 = 0;
      if (iVar43 != 8) {
        iVar34 = iVar43;
      }
    }
    if (local_740 != (LineData *)0x0) {
      operator_delete(local_740,(long)pLVar36 - (long)pLVar26);
    }
    if (pLVar26 != (pointer)0x0) {
      operator_delete(pLVar26,(long)local_7d0 - (long)pLVar26);
    }
    bVar48 = iVar34 == 0;
  }
  if (bVar48) {
    shaderWriteBarrier._0_8_ = &shaderWriteBarrier.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>((string *)&shaderWriteBarrier,"OK","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,shaderWriteBarrier._0_8_,
               (long)shaderWriteBarrier.pNext + shaderWriteBarrier._0_8_);
  }
  else {
    shaderWriteBarrier._0_8_ = &shaderWriteBarrier.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>((string *)&shaderWriteBarrier,"Failure","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,shaderWriteBarrier._0_8_,
               (long)shaderWriteBarrier.pNext + shaderWriteBarrier._0_8_);
  }
  if ((VkAccessFlags *)shaderWriteBarrier._0_8_ != &shaderWriteBarrier.srcAccessMask) {
    operator_delete((void *)shaderWriteBarrier._0_8_,shaderWriteBarrier._16_8_ + 1);
  }
  if (additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)additionalSegmentLengths.super__Vector_base<float,_std::allocator<float>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (obj != (undefined1  [8])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_290,(VkPipeline)obj);
  }
  if (commandBuffer != 0) {
    local_4d8 = (undefined1  [8])commandBuffer;
    (**(code **)(*pvVar9 + 0x240))(pvVar9,uVar10,uVar11,1);
  }
  if (local_278.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_270,local_278);
  }
  if (local_308.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_300,local_308);
  }
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_250,local_258);
  }
  if (local_358.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_350,local_358);
  }
  if (local_4f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_4d8 = (undefined1  [8])local_4f8;
    (**(code **)(*plStack_4f0 + 0x1e8))(plStack_4f0,_local_4e8,_dStack_4e0,1);
  }
  if (local_238.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_230,local_238);
  }
  if (local_2e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_2e0,local_2e8);
  }
  if (tessLevelsBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(tessLevelsBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    tessLevelsBuffer.m_allocation.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  if (tessLevelsBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
      m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&tessLevelsBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                deleter,(VkBuffer)
                        tessLevelsBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                        m_data.object.m_internal);
  }
  if (resultBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(resultBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const SpacingMode spacingMode)
{
	DE_ASSERT(spacingMode == SPACINGMODE_FRACTIONAL_ODD || spacingMode == SPACINGMODE_FRACTIONAL_EVEN);

	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	const std::vector<float>	tessLevelCases = genTessLevelCases();
	const int					maxNumVertices = 1 + getClampedRoundedTessLevel(spacingMode, *std::max_element(tessLevelCases.begin(), tessLevelCases.end()));

	// Result buffer: generated tess coords go here.

	const VkDeviceSize resultBufferSizeBytes = sizeof(int) + sizeof(float) * maxNumVertices;
	const Buffer	   resultBuffer			 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Outer1 tessellation level constant buffer.

	const VkDeviceSize tessLevelsBufferSizeBytes = sizeof(float);  // we pass only outer1
	const Buffer	   tessLevelsBuffer			 (vk, device, allocator, makeBufferCreateInfo(tessLevelsBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet			(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  tessLevelsBufferInfo	= makeDescriptorBufferInfo(tessLevelsBuffer.get(), 0ull, tessLevelsBufferSizeBytes);
	const VkDescriptorBufferInfo  resultBufferInfo		= makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &tessLevelsBufferInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline

	const Unique<VkRenderPass>		renderPass	  (makeRenderPassWithoutAttachments	(vk, device));
	const Unique<VkFramebuffer>		framebuffer	  (makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout				(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool		  (makeCommandPool					(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer	  (allocateCommandBuffer			(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setShader(vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get("tese"), DE_NULL)
		.build(vk, device, *pipelineLayout, *renderPass));

	// Data that will be verified across all cases
	std::vector<float> additionalSegmentLengths;
	std::vector<int>   additionalSegmentLocations;

	bool success = false;

	// Repeat the test for all tessellation coords cases
	for (deUint32 tessLevelCaseNdx = 0; tessLevelCaseNdx < tessLevelCases.size(); ++tessLevelCaseNdx)
	{
		// Upload tessellation levels data to the input buffer
		{
			const Allocation& alloc			  = tessLevelsBuffer.getAllocation();
			float* const	  tessLevelOuter1 = static_cast<float*>(alloc.getHostPtr());

			*tessLevelOuter1 = tessLevelCases[tessLevelCaseNdx];
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), tessLevelsBufferSizeBytes);
		}

		// Clear the results buffer
		{
			const Allocation& alloc = resultBuffer.getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
		}

		beginCommandBuffer(vk, *cmdBuffer);

		// Begin render pass
		beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		{
			const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify the result.
		{
			tcu::TestLog& log = context.getTestContext().getLog();

			const Allocation& resultAlloc = resultBuffer.getAllocation();
			invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

			const deInt32 numResults = *static_cast<deInt32*>(resultAlloc.getHostPtr());
			const std::vector<float> resultTessCoords = readFloatArray(numResults, resultAlloc.getHostPtr(), sizeof(deInt32));

			// Outputs
			float additionalSegmentLength;
			int   additionalSegmentLocation;

			success = verifyFractionalSpacingSingle(log, spacingMode, tessLevelCases[tessLevelCaseNdx], resultTessCoords,
													&additionalSegmentLength, &additionalSegmentLocation);

			if (!success)
				break;

			additionalSegmentLengths.push_back(additionalSegmentLength);
			additionalSegmentLocations.push_back(additionalSegmentLocation);
		}
	} // for tessLevelCaseNdx

	if (success)
		success = verifyFractionalSpacingMultiple(context.getTestContext().getLog(), spacingMode, tessLevelCases, additionalSegmentLengths, additionalSegmentLocations);

	return (success ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Failure"));
}